

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

bool __thiscall
EthBasePort::CheckFirewirePacket
          (EthBasePort *this,uchar *packet,size_t length,nodeid_t node,uint tcode,uint tl)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  ulong uVar4;
  size_t length_recv;
  quadlet_t *qpacket;
  uint tl_recv;
  uint tcode_recv;
  uint uStack_30;
  nodeid_t src_node;
  uint tl_local;
  uint tcode_local;
  nodeid_t node_local;
  size_t length_local;
  uchar *packet_local;
  EthBasePort *this_local;
  
  tcode_recv = tl;
  uStack_30 = tcode;
  tl_local._2_2_ = node;
  _tcode_local = length;
  length_local = (size_t)packet;
  packet_local = (uchar *)this;
  bVar1 = checkCRC(packet);
  if (bVar1) {
    GetFirewireHeaderInfo
              ((uchar *)length_local,(nodeid_t *)((long)&tl_recv + 2),(uint *)((long)&qpacket + 4),
               (uint *)&qpacket);
    if (qpacket._4_4_ == uStack_30) {
      if ((tl_local._2_2_ == 0x3f) || (tl_recv._2_2_ == tl_local._2_2_)) {
        if ((uint)qpacket == tcode_recv) {
          if ((uStack_30 == 7) &&
             (uVar4 = (ulong)(*(uint *)(length_local + 0xc) >> 0x10), uVar4 != _tcode_local)) {
            poVar2 = std::operator<<((this->super_BasePort).outStr,
                                     "Inconsistent length: received = ");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4);
            poVar2 = std::operator<<(poVar2,", expected = ");
            pvVar3 = (void *)std::ostream::operator<<(poVar2,_tcode_local);
            std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          poVar2 = std::operator<<((this->super_BasePort).outStr,
                                   "Inconsistent Firewire TL: received = ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)qpacket);
          poVar2 = std::operator<<(poVar2,", expected = ");
          pvVar3 = (void *)std::ostream::operator<<(poVar2,tcode_recv);
          std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = false;
        }
      }
      else {
        poVar2 = std::operator<<((this->super_BasePort).outStr,
                                 "Inconsistent source node: received = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,tl_recv._2_2_);
        poVar2 = std::operator<<(poVar2,", expected = ");
        pvVar3 = (void *)std::ostream::operator<<(poVar2,tl_local._2_2_);
        std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
    }
    else {
      poVar2 = std::operator<<((this->super_BasePort).outStr,"Unexpected tcode: received = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,qpacket._4_4_);
      poVar2 = std::operator<<(poVar2,", expected = ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,uStack_30);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  else {
    poVar2 = std::operator<<((this->super_BasePort).outStr,"CheckFirewirePacket: CRC error");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EthBasePort::CheckFirewirePacket(const unsigned char *packet, size_t length, nodeid_t node, unsigned int tcode,
                                      unsigned int tl)
{
    if (!checkCRC(packet)) {
        outStr << "CheckFirewirePacket: CRC error" << std::endl;
        return false;
    }

    nodeid_t src_node;
    unsigned int tcode_recv;
    unsigned int tl_recv;
    GetFirewireHeaderInfo(packet, &src_node, &tcode_recv, &tl_recv);

    if (tcode_recv != tcode) {
        outStr << "Unexpected tcode: received = " << tcode_recv << ", expected = " << tcode << std::endl;
        return false;
    }
    if ((node != FW_NODE_BROADCAST) && (src_node != node)) {
        outStr << "Inconsistent source node: received = " << src_node << ", expected = " << node << std::endl;
        return false;
    }
    if (tl_recv != tl) {
        outStr << "Inconsistent Firewire TL: received = " << tl_recv
               << ", expected = " << tl << std::endl;
        return false;
    }
    // TODO: could also check QRESPONSE length
    if (tcode == BRESPONSE) {
        const quadlet_t *qpacket = reinterpret_cast<const quadlet_t *>(packet);
        size_t length_recv = (qpacket[3]&0xffff0000) >> 16;
        if (length_recv != length) {
            outStr << "Inconsistent length: received = " << length_recv << ", expected = " << length << std::endl;
            return false;
        }
    }
    return true;
}